

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool mz_zip_reader_extract_to_file
                  (mz_zip_archive *pZip,mz_uint file_index,char *pDst_filename,mz_uint flags)

{
  mz_bool mVar1;
  int iVar2;
  FILE *__stream;
  FILE *pFile;
  mz_zip_archive_file_stat file_stat;
  mz_bool status;
  mz_uint flags_local;
  char *pDst_filename_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  file_stat.m_comment._508_4_ = flags;
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&pFile);
  if (mVar1 == 0) {
    pZip_local._0_4_ = 0;
  }
  else if ((file_stat.m_local_header_ofs._4_4_ == 0) && (file_stat.m_is_directory != 0)) {
    __stream = fopen64(pDst_filename,"wb");
    if (__stream == (FILE *)0x0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
      }
      pZip_local._0_4_ = 0;
    }
    else {
      file_stat.m_comment._504_4_ =
           mz_zip_reader_extract_to_callback
                     (pZip,file_index,mz_zip_file_write_callback,__stream,
                      file_stat.m_comment._508_4_);
      iVar2 = fclose(__stream);
      if (iVar2 == -1) {
        if ((file_stat.m_comment._504_4_ != 0) && (pZip != (mz_zip_archive *)0x0)) {
          pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
        }
        file_stat.m_comment[0x1f8] = '\0';
        file_stat.m_comment[0x1f9] = '\0';
        file_stat.m_comment[0x1fa] = '\0';
        file_stat.m_comment[0x1fb] = '\0';
      }
      if (file_stat.m_comment._504_4_ != 0) {
        mz_zip_set_file_times(pDst_filename,file_stat._16_8_,file_stat._16_8_);
      }
      pZip_local._0_1_ = file_stat.m_comment[0x1f8];
      pZip_local._1_1_ = file_stat.m_comment[0x1f9];
      pZip_local._2_1_ = file_stat.m_comment[0x1fa];
      pZip_local._3_1_ = file_stat.m_comment[0x1fb];
    }
  }
  else {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    }
    pZip_local._0_4_ = 0;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_extract_to_file(mz_zip_archive *pZip, mz_uint file_index, const char *pDst_filename, mz_uint flags)
{
    mz_bool status;
    mz_zip_archive_file_stat file_stat;
    MZ_FILE *pFile;

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    if ((file_stat.m_is_directory) || (!file_stat.m_is_supported))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    pFile = MZ_FOPEN(pDst_filename, "wb");
    if (!pFile)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

    status = mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_file_write_callback, pFile, flags);

    if (MZ_FCLOSE(pFile) == EOF)
    {
        if (status)
            mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);

        status = MZ_FALSE;
    }

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
    if (status)
        mz_zip_set_file_times(pDst_filename, file_stat.m_time, file_stat.m_time);
#endif

    return status;
}